

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# populators-inl.h
# Opt level: O2

void __thiscall
spdlog::populators::pid_populator::populate(pid_populator *this,log_msg *param_1,json *dest)

{
  json_value jVar1;
  __pid_t _Var2;
  reference pvVar3;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_18;
  
  _Var2 = getpid();
  local_18.m_value = (json_value)(long)_Var2;
  local_18.m_type = number_integer;
  pvVar3 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                       *)dest,"pid");
  local_18.m_type = pvVar3->m_type;
  pvVar3->m_type = number_integer;
  jVar1 = pvVar3->m_value;
  pvVar3->m_value = local_18.m_value;
  local_18.m_value = jVar1;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::~basic_json(&local_18);
  return;
}

Assistant:

SPDLOG_INLINE void pid_populator::populate(const details::log_msg &, nlohmann::json &dest)
{
    dest["pid"] = details::os::pid();
}